

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int rfft2b_(int *ldim,int *l,int *m,double *r__,double *wsave,int *lensav,double *work,int *lenwrk,
           int *ier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long in_RCX;
  long lVar8;
  int iVar9;
  int iVar10;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R9;
  int *lot;
  double dVar11;
  int *piVar12;
  int *lensav_00;
  double *in_stack_00000008;
  int *in_stack_00000010;
  undefined4 *in_stack_00000018;
  int mwsav;
  int lwsav;
  int mmsav;
  int modm;
  int modl;
  int ier1;
  int ldx;
  int ldw;
  int ldh;
  int j;
  int i__;
  int i__3;
  int i__2;
  int i__1;
  int r_offset;
  int r_dim1;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar13;
  int *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int iVar14;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  int iVar15;
  uint in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int iVar16;
  int iVar17;
  undefined4 in_stack_ffffffffffffffa8;
  
  iVar13 = *in_RDI;
  iVar1 = iVar13 + 1;
  lVar7 = in_RCX + (long)iVar1 * -8;
  *in_stack_00000018 = 0;
  iVar14 = *in_RSI;
  lot = (int *)log((double)*in_RSI);
  dVar11 = log(2.0);
  iVar2 = iVar14 + (int)((double)lot / dVar11) + 4;
  iVar3 = *in_RDX << 1;
  piVar12 = (int *)log((double)*in_RDX);
  dVar11 = log(2.0);
  iVar4 = iVar3 + (int)((double)piVar12 / dVar11) + 4;
  iVar15 = *in_RDX;
  lensav_00 = (int *)log((double)*in_RDX);
  dVar11 = log(2.0);
  iVar5 = iVar15 + (int)((double)lensav_00 / dVar11) + 4;
  iVar9 = *in_RSI % 2;
  iVar10 = *in_RDX % 2;
  if (*in_R9 < iVar2 + iVar4 + iVar5) {
    *in_stack_00000018 = 2;
  }
  else if (*in_stack_00000010 < (*in_RSI + 1) * *in_RDX) {
    *in_stack_00000018 = 3;
  }
  else if (*in_RDI < *in_RSI) {
    *in_stack_00000018 = 5;
  }
  else {
    iVar6 = *in_RDX;
    for (iVar17 = 2; iVar17 <= ((iVar6 + 1) / 2) * 2 + -1; iVar17 = iVar17 + 1) {
      lVar8 = (long)(iVar17 * iVar13 + 1);
      *(double *)(lVar7 + lVar8 * 8) =
           *(double *)(lVar7 + (long)(iVar17 * iVar13 + 1) * 8) + *(double *)(lVar7 + lVar8 * 8);
    }
    iVar6 = *in_RDX;
    for (iVar17 = 3; iVar17 <= iVar6; iVar17 = iVar17 + 2) {
      *(ulong *)(lVar7 + (long)(iVar17 * iVar13 + 1) * 8) =
           *(ulong *)(lVar7 + (long)(iVar17 * iVar13 + 1) * 8) ^ 0x8000000000000000;
    }
    rfftmb_(lot,(int *)CONCAT44(iVar14,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
            (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
            (double *)&stack0xffffffffffffff94,in_stack_00000010,
            (double *)CONCAT44(iVar15,in_stack_ffffffffffffff70),lensav_00,
            (double *)CONCAT44(iVar2,iVar4),(int *)CONCAT44(iVar10,iVar5),
            (int *)CONCAT44(in_stack_ffffffffffffff94,iVar9));
    iVar6 = (*in_RSI + 1) / 2;
    if (1 < iVar6) {
      iVar16 = iVar6 * 2;
      r2w_(in_RDI,(int *)&stack0xffffffffffffff9c,in_RSI,in_RDX,(double *)(lVar7 + (long)iVar1 * 8),
           in_stack_00000008);
      cfftmb_((int *)CONCAT44(iVar15,in_stack_ffffffffffffff70),piVar12,
              (int *)CONCAT44(iVar3,in_stack_ffffffffffffff60),lot,
              (fft_complex_t *)CONCAT44(iVar14,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
              (double *)CONCAT44(in_stack_ffffffffffffff94,iVar9),
              (int *)CONCAT44(iVar16,in_stack_ffffffffffffff98),(double *)CONCAT44(iVar17,iVar6),
              (int *)CONCAT44(*in_RSI * *in_RDX,in_stack_ffffffffffffffa8),
              (int *)CONCAT44(iVar6 + -1,iVar6 * *in_RDX));
      if (in_stack_ffffffffffffff94 != 0) {
        *in_stack_00000018 = 0x14;
        return 0;
      }
      w2r_(in_RDI,(int *)&stack0xffffffffffffff9c,in_RSI,in_RDX,(double *)(lVar7 + (long)iVar1 * 8),
           in_stack_00000008);
    }
    if (iVar9 == 0) {
      iVar1 = *in_RDX;
      for (iVar3 = 2; iVar3 <= ((iVar1 + 1) / 2) * 2 + -1; iVar3 = iVar3 + 1) {
        lVar8 = (long)(*in_RSI + iVar3 * iVar13);
        *(double *)(lVar7 + lVar8 * 8) =
             *(double *)(lVar7 + (long)(*in_RSI + iVar3 * iVar13) * 8) +
             *(double *)(lVar7 + lVar8 * 8);
      }
      iVar1 = *in_RDX;
      for (iVar3 = 3; iVar3 <= iVar1; iVar3 = iVar3 + 2) {
        *(ulong *)(lVar7 + (long)(*in_RSI + iVar3 * iVar13) * 8) =
             *(ulong *)(lVar7 + (long)(*in_RSI + iVar3 * iVar13) * 8) ^ 0x8000000000000000;
      }
      rfftmb_(lot,(int *)CONCAT44(iVar14,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
              (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              (double *)&stack0xffffffffffffff94,in_stack_00000010,
              (double *)CONCAT44(iVar15,in_stack_ffffffffffffff70),lensav_00,
              (double *)CONCAT44(iVar2,iVar4),(int *)CONCAT44(iVar10,iVar5),
              (int *)((ulong)in_stack_ffffffffffffff94 << 0x20));
    }
    iVar1 = ((*in_RSI + 1) / 2) * 2 + -1;
    for (iVar3 = 2; iVar3 <= iVar1; iVar3 = iVar3 + 1) {
      iVar6 = *in_RDX;
      for (iVar17 = 1; iVar17 <= iVar6; iVar17 = iVar17 + 1) {
        lVar8 = (long)(iVar3 + iVar17 * iVar13);
        *(double *)(lVar7 + lVar8 * 8) =
             *(double *)(lVar7 + (long)(iVar3 + iVar17 * iVar13) * 8) +
             *(double *)(lVar7 + lVar8 * 8);
      }
    }
    iVar3 = *in_RDX;
    for (iVar6 = 1; iVar6 <= iVar3; iVar6 = iVar6 + 1) {
      for (iVar17 = 3; iVar17 <= iVar1; iVar17 = iVar17 + 2) {
        *(ulong *)(lVar7 + (long)(iVar17 + iVar6 * iVar13) * 8) =
             *(ulong *)(lVar7 + (long)(iVar17 + iVar6 * iVar13) * 8) ^ 0x8000000000000000;
      }
    }
    iVar13 = *in_RSI;
    piVar12 = (int *)log((double)*in_RSI);
    log(2.0);
    rfftmb_(lot,(int *)CONCAT44(iVar14,in_stack_ffffffffffffff50),piVar12,
            (int *)CONCAT44(iVar13,in_stack_ffffffffffffff40),(double *)&stack0xffffffffffffff94,
            in_stack_00000010,(double *)CONCAT44(iVar15,in_stack_ffffffffffffff70),lensav_00,
            (double *)CONCAT44(iVar2,iVar4),(int *)CONCAT44(iVar10,iVar5),
            (int *)CONCAT44(in_stack_ffffffffffffff94,iVar9));
    if (in_stack_ffffffffffffff94 != 0) {
      *in_stack_00000018 = 0x14;
    }
  }
  return 0;
}

Assistant:

int rfft2b_(int *ldim, int *l, int *m, fft_real_t *r__,
	 fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk, int *
	ier)
{
    /* System generated locals */
    int r_dim1, r_offset, i__1, i__2, i__3;

    /* Builtin functions */


    /* Local variables */
     int i__, j;
    extern /* Subroutine */ int r2w_(int *, int *, int *, int
	    *, fft_real_t *, fft_real_t *), w2r_(int *, int *, int *, int
	    *, fft_real_t *, fft_real_t *);
     int ldh, ldw, ldx, ier1, modl, modm, mmsav, lwsav, mwsav;
    extern /* Subroutine */ int cfftmb_(), rfftmb_(int *, int *,
	    int *, int *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *
	    , int *, int *), xerfft_(char *, int *, ftnlen);



/* INITIALIZE IER */

    /* Parameter adjustments */
    r_dim1 = *ldim;
    r_offset = 1 + r_dim1;
    r__ -= r_offset;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

/* VERIFY LENSAV */

    lwsav = *l + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    mwsav = (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    mmsav = *m + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    modl = *l % 2;
    modm = *m % 2;

    if (*lensav < lwsav + mwsav + mmsav) {
	*ier = 2;
	//xerfft_("RFFT2F", &c__6, (ftnlen)6);
	goto L100;
    }

/* VERIFY LENWRK */

    if (*lenwrk < (*l + 1) * *m) {
	*ier = 3;
	//xerfft_("RFFT2F", &c__8, (ftnlen)6);
	goto L100;
    }

/* VERIFY LDIM IS AS BIG AS L */

    if (*ldim < *l) {
	*ier = 5;
	//xerfft_("RFFT2F", &c_n6, (ftnlen)6);
	goto L100;
    }

/* TRANSFORM SECOND DIMENSION OF ARRAY */

    i__1 = ((*m + 1) / 2 << 1) - 1;
    for (j = 2; j <= i__1; ++j) {
	r__[j * r_dim1 + 1] += r__[j * r_dim1 + 1];
    }
    i__1 = *m;
    for (j = 3; j <= i__1; j += 2) {
	r__[j * r_dim1 + 1] = -r__[j * r_dim1 + 1];
    }
    i__1 = *m * *ldim;
    rfftmb_(&c__1, &c__1, m, ldim, &r__[r_offset], &i__1, &wsave[lwsav +
	    mwsav + 1], &mmsav, &work[1], lenwrk, &ier1);
    ldh = (*l + 1) / 2;
    if (ldh > 1) {
	ldw = ldh + ldh;

/*     R AND WORK ARE SWITCHED BECAUSE THE THE FIRST DIMENSION */
/*     OF THE INPUT TO COMPLEX CFFTMF MUST BE EVEN. */

	r2w_(ldim, &ldw, l, m, &r__[r_offset], &work[1]);
	i__1 = ldh - 1;
	i__2 = ldh * *m;
	i__3 = *l * *m;
	cfftmb_(&i__1, &c__1, m, &ldh, (complex*)&work[2], &i__2, &wsave[lwsav + 1], &
		mwsav, &r__[r_offset], &i__3, &ier1);
	if (ier1 != 0) {
	    *ier = 20;
	    //xerfft_("RFFT2B", &c_n5, (ftnlen)6);
	    goto L100;
	}
	w2r_(ldim, &ldw, l, m, &r__[r_offset], &work[1]);
    }

    if (modl == 0) {
	i__1 = ((*m + 1) / 2 << 1) - 1;
	for (j = 2; j <= i__1; ++j) {
	    r__[*l + j * r_dim1] += r__[*l + j * r_dim1];
	}
	i__1 = *m;
	for (j = 3; j <= i__1; j += 2) {
	    r__[*l + j * r_dim1] = -r__[*l + j * r_dim1];
	}
	i__1 = *m * *ldim;
	rfftmb_(&c__1, &c__1, m, ldim, &r__[*l + r_dim1], &i__1, &wsave[lwsav
		+ mwsav + 1], &mmsav, &work[1], lenwrk, &ier1);
    }

/*     PRINT*, 'BACKWARD TRANSFORM IN THE J DIRECTION' */
/*     DO I=1,L */
/*       PRINT*, (R(I,J),J=1,M) */
/*     END DO */

/* TRANSFORM FIRST DIMENSION OF ARRAY */

    ldx = ((*l + 1) / 2 << 1) - 1;
    i__1 = ldx;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *m;
	for (j = 1; j <= i__2; ++j) {
	    r__[i__ + j * r_dim1] += r__[i__ + j * r_dim1];
	}
    }
    i__1 = *m;
    for (j = 1; j <= i__1; ++j) {
	i__2 = ldx;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    r__[i__ + j * r_dim1] = -r__[i__ + j * r_dim1];
	}
    }
    i__1 = *m * *ldim;
    i__2 = *l + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    rfftmb_(m, ldim, l, &c__1, &r__[r_offset], &i__1, &wsave[1], &i__2, &work[
	    1], lenwrk, &ier1);


/*     PRINT*, 'BACKWARD TRANSFORM IN THE I DIRECTION' */
/*     DO I=1,L */
/*       PRINT*, (R(I,J),J=1,M) */
/*     END DO */

    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("RFFT2F", &c_n5, (ftnlen)6);
	goto L100;
    }

    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("RFFT2F", &c_n5, (ftnlen)6);
	goto L100;
    }

L100:

    return 0;
}